

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O1

int Pdr_SetContainsSimple(Pdr_Set_t *pOld,Pdr_Set_t *pNew)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  
  if ((long)pOld->nLits < 1) {
    __assert_fail("pOld->nLits > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrUtil.c"
                  ,0x1a7,"int Pdr_SetContainsSimple(Pdr_Set_t *, Pdr_Set_t *)");
  }
  if ((long)pNew->nLits < 1) {
    __assert_fail("pNew->nLits > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrUtil.c"
                  ,0x1a8,"int Pdr_SetContainsSimple(Pdr_Set_t *, Pdr_Set_t *)");
  }
  lVar5 = (long)pNew->nLits * 4 + 0x10;
  lVar4 = (long)pOld->nLits * 4 + 0x10;
  do {
    iVar1 = *(int *)((long)&pOld->Sign + lVar4);
    if (iVar1 == -1) {
      __assert_fail("*pOldInt != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrUtil.c"
                    ,0x1ad,"int Pdr_SetContainsSimple(Pdr_Set_t *, Pdr_Set_t *)");
    }
    while (iVar2 = *(int *)((long)&pNew->Sign + lVar5), iVar2 == -1) {
      bVar3 = lVar5 < 0x18;
      lVar5 = lVar5 + -4;
      if (bVar3) {
        return 1;
      }
    }
    if (lVar4 < 0x14) {
      return 0;
    }
    if (iVar2 == iVar1) {
      lVar5 = lVar5 + -4;
    }
    else if (iVar1 <= iVar2) {
      return 0;
    }
    lVar4 = lVar4 + -4;
  } while (0x13 < lVar5);
  return 1;
}

Assistant:

int Pdr_SetContainsSimple( Pdr_Set_t * pOld, Pdr_Set_t * pNew )
{
    int * pOldInt, * pNewInt;
    assert( pOld->nLits > 0 );
    assert( pNew->nLits > 0 );
    pOldInt = pOld->Lits + pOld->nLits - 1;
    pNewInt = pNew->Lits + pNew->nLits - 1;
    while ( pNew->Lits <= pNewInt )
    {
        assert( *pOldInt != -1 );
        if ( *pNewInt == -1 )
        {
            pNewInt--;
            continue;
        }
        if ( pOld->Lits > pOldInt )
            return 0;
        assert( *pNewInt != -1 );
        assert( *pOldInt != -1 );
        if ( *pNewInt == *pOldInt )
            pNewInt--, pOldInt--;
        else if ( *pNewInt < *pOldInt )
            pOldInt--;
        else
            return 0;
    }
    return 1;
}